

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O0

void pdqsort_detail::
     insertion_sort<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,std::less<HighsDomainChange>>
               (undefined8 param_1,undefined8 param_2)

{
  HighsBoundType HVar1;
  bool bVar2;
  reference pHVar3;
  __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
  *this;
  T tmp;
  __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
  sift_1;
  __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
  sift;
  __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
  cur;
  HighsDomainChange *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  reference in_stack_ffffffffffffffa8;
  __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
  local_48;
  double local_40;
  undefined8 local_38;
  __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
  local_30;
  __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
  local_28;
  __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
  local_20 [2];
  undefined8 local_10;
  undefined8 local_8;
  
  local_10 = param_2;
  local_8 = param_1;
  bVar2 = __gnu_cxx::operator==
                    ((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                      *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                      *)in_stack_ffffffffffffff98);
  if (!bVar2) {
    local_20[0] = __gnu_cxx::
                  __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                  ::operator+((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                               *)in_stack_ffffffffffffffa8,
                              CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                               *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                              (__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                               *)in_stack_ffffffffffffff98), bVar2) {
      local_28._M_current = local_20[0]._M_current;
      local_30 = __gnu_cxx::
                 __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                 ::operator-((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                              *)in_stack_ffffffffffffffa8,
                             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      __gnu_cxx::
      __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
      ::operator*(&local_28);
      __gnu_cxx::
      __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
      ::operator*(&local_30);
      bVar2 = std::less<HighsDomainChange>::operator()
                        ((less<HighsDomainChange> *)
                         CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         in_stack_ffffffffffffff98,(HighsDomainChange *)0x5f6f2d);
      if (bVar2) {
        pHVar3 = __gnu_cxx::
                 __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                 ::operator*(&local_28);
        local_40 = pHVar3->boundval;
        local_38._0_4_ = pHVar3->column;
        local_38._4_4_ = pHVar3->boundtype;
        do {
          in_stack_ffffffffffffffa8 =
               __gnu_cxx::
               __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
               ::operator*(&local_30);
          local_48 = __gnu_cxx::
                     __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                     ::operator--((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                                   *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
          pHVar3 = __gnu_cxx::
                   __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                   ::operator*(&local_48);
          pHVar3->boundval = in_stack_ffffffffffffffa8->boundval;
          HVar1 = in_stack_ffffffffffffffa8->boundtype;
          pHVar3->column = in_stack_ffffffffffffffa8->column;
          pHVar3->boundtype = HVar1;
          bVar2 = __gnu_cxx::operator!=
                            ((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                              *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                             (__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                              *)in_stack_ffffffffffffff98);
          in_stack_ffffffffffffffa4 = in_stack_ffffffffffffffa4 & 0xffffff;
          if (bVar2) {
            this = __gnu_cxx::
                   __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                   ::operator--(&local_30);
            __gnu_cxx::
            __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
            ::operator*(this);
            bVar2 = std::less<HighsDomainChange>::operator()
                              ((less<HighsDomainChange> *)
                               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                               in_stack_ffffffffffffff98,(HighsDomainChange *)0x5f6fd0);
            in_stack_ffffffffffffffa4 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffffa4);
          }
        } while ((char)(in_stack_ffffffffffffffa4 >> 0x18) != '\0');
        pHVar3 = __gnu_cxx::
                 __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                 ::operator*(&local_28);
        pHVar3->boundval = local_40;
        pHVar3->column = (undefined4)local_38;
        pHVar3->boundtype = local_38._4_4_;
      }
      __gnu_cxx::
      __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
      ::operator++(local_20);
    }
  }
  return;
}

Assistant:

inline void insertion_sort(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        if (begin == end) return;

        for (Iter cur = begin + 1; cur != end; ++cur) {
            Iter sift = cur;
            Iter sift_1 = cur - 1;

            // Compare first so we can avoid 2 moves for an element already positioned correctly.
            if (comp(*sift, *sift_1)) {
                T tmp = PDQSORT_PREFER_MOVE(*sift);

                do { *sift-- = PDQSORT_PREFER_MOVE(*sift_1); }
                while (sift != begin && comp(tmp, *--sift_1));

                *sift = PDQSORT_PREFER_MOVE(tmp);
            }
        }
    }